

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O0

string * __thiscall
Logger::formatError_abi_cxx11_
          (string *__return_storage_ptr__,Logger *this,ErrorType type,char *text)

{
  size_t sVar1;
  undefined4 in_register_00000014;
  char **in_R8;
  allocator<char> local_7d;
  undefined4 local_7c;
  string local_78;
  string *local_58;
  string *fileName;
  string local_40 [8];
  string position;
  char *text_local;
  ErrorType type_local;
  
  position.field_2._8_8_ = CONCAT44(in_register_00000014,type);
  std::__cxx11::string::string(local_40);
  if (((Global.memoryMode & 1U) == 0) && (sVar1 = FileList::size(&Global.fileList), sVar1 != 0)) {
    local_58 = FileList::relativeString_abi_cxx11_(&Global.fileList,Global.FileInfo.FileNum);
    tinyformat::format<std::__cxx11::string,int>
              (&local_78,(tinyformat *)"%s(%d) ",(char *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &Global.FileInfo.LineNumber,(int *)in_R8);
    std::__cxx11::string::operator=(local_40,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  switch((ulong)this & 0xffffffff) {
  case 0:
    tinyformat::format<std::__cxx11::string,char_const*>
              (__return_storage_ptr__,(tinyformat *)"%swarning: %s",(char *)local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&position.field_2 + 8),in_R8);
    break;
  case 1:
    tinyformat::format<std::__cxx11::string,char_const*>
              (__return_storage_ptr__,(tinyformat *)"%serror: %s",(char *)local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&position.field_2 + 8),in_R8);
    break;
  case 2:
    tinyformat::format<std::__cxx11::string,char_const*>
              (__return_storage_ptr__,(tinyformat *)"%sfatal error: %s",(char *)local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&position.field_2 + 8),in_R8);
    break;
  case 3:
    tinyformat::format<std::__cxx11::string,char_const*>
              (__return_storage_ptr__,(tinyformat *)"%snotice: %s",(char *)local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&position.field_2 + 8),in_R8);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_7d);
    std::allocator<char>::~allocator(&local_7d);
  }
  local_7c = 1;
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Logger::formatError(ErrorType type, const char* text)
{
	std::string position;

	if (!Global.memoryMode && Global.fileList.size() > 0)
	{
		const auto& fileName = Global.fileList.relativeString(Global.FileInfo.FileNum);
		position = tfm::format("%s(%d) ", fileName, Global.FileInfo.LineNumber);
	}

	switch (type)
	{
	case Warning:
		return tfm::format("%swarning: %s",position,text);
	case Error:
		return tfm::format("%serror: %s",position,text);
	case FatalError:
		return tfm::format("%sfatal error: %s",position,text);
	case Notice:
		return tfm::format("%snotice: %s",position,text);
	}

	return "";
}